

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O1

sat_solver * Abc_MfsCreateSolverResub(Mfs_Man_t *p,int *pCands,int nCands,int fInvert)

{
  int iVarA;
  Aig_Man_t *pAVar1;
  int **ppiVar2;
  Cnf_Dat_t *pCVar3;
  int *piVar4;
  int iVar5;
  undefined8 in_RAX;
  Vec_Ptr_t *pVVar6;
  sat_solver *s;
  Vec_Int_t *pVVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int Lits [2];
  undefined8 local_38;
  
  pAVar1 = p->pAigWin;
  uVar11 = p->vDivs->nSize;
  uVar9 = ~uVar11 + pAVar1->nObjs[3];
  local_38 = in_RAX;
  if (((int)uVar9 < 0) || (pAVar1->vCos->nSize <= (int)uVar9)) {
LAB_004c8341:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  local_38 = CONCAT44(local_38._4_4_,
                      (uint)(fInvert != 0) +
                      p->pCnf->pVarNums[*(int *)((long)pAVar1->vCos->pArray[uVar9] + 0x24)] * 2);
  p->vProjVarsCnf->nSize = 0;
  uVar11 = pAVar1->nObjs[3] - uVar11;
  pVVar6 = p->pAigWin->vCos;
  if ((int)uVar11 < pVVar6->nSize) {
    uVar10 = (ulong)uVar11;
    do {
      if ((int)uVar11 < 0) goto LAB_004c8341;
      iVar5 = p->pCnf->pVarNums[*(int *)((long)pVVar6->pArray[uVar10] + 0x24)];
      if (iVar5 < 0) {
        __assert_fail("p->pCnf->pVarNums[pObjPo->Id] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsInter.c"
                      ,0x66,"sat_solver *Abc_MfsCreateSolverResub(Mfs_Man_t *, int *, int, int)");
      }
      Vec_IntPush(p->vProjVarsCnf,iVar5);
      uVar10 = uVar10 + 1;
      pVVar6 = p->pAigWin->vCos;
    } while ((int)uVar10 < pVVar6->nSize);
  }
  if (p->vProjVarsCnf->nSize != p->vDivs->nSize) {
    __assert_fail("Vec_IntSize(p->vProjVarsCnf) == Vec_PtrSize(p->vDivs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsInter.c"
                  ,0x69,"sat_solver *Abc_MfsCreateSolverResub(Mfs_Man_t *, int *, int, int)");
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,p->pCnf->nVars * 2 + p->vDivs->nSize);
  if (pCands != (int *)0x0) {
    sat_solver_store_alloc(s);
  }
  lVar8 = 0;
  while (lVar8 < p->pCnf->nClauses) {
    ppiVar2 = p->pCnf->pClauses;
    iVar5 = sat_solver_addclause(s,ppiVar2[lVar8],ppiVar2[lVar8 + 1]);
    lVar8 = lVar8 + 1;
    if (iVar5 == 0) goto LAB_004c8324;
  }
  iVar5 = sat_solver_addclause(s,(lit *)&local_38,(lit *)((long)&local_38 + 4));
  if (iVar5 == 0) goto LAB_004c8324;
  if (p->pPars->fOneHotness != 0) {
    p->pSat = s;
    iVar5 = Abc_NtkAddOneHotness(p);
    if (iVar5 == 0) {
      return (sat_solver *)0x0;
    }
    p->pSat = (sat_solver *)0x0;
  }
  if (pCands != (int *)0x0) {
    sat_solver_store_mark_clauses_a(s);
  }
  pCVar3 = p->pCnf;
  if (0 < pCVar3->nLiterals) {
    piVar4 = *pCVar3->pClauses;
    lVar8 = 0;
    do {
      piVar4[lVar8] = piVar4[lVar8] + pCVar3->nVars * 2;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pCVar3->nLiterals);
  }
  lVar8 = 0;
  while (lVar8 < p->pCnf->nClauses) {
    ppiVar2 = p->pCnf->pClauses;
    iVar5 = sat_solver_addclause(s,ppiVar2[lVar8],ppiVar2[lVar8 + 1]);
    lVar8 = lVar8 + 1;
    if (iVar5 == 0) goto LAB_004c8324;
  }
  if (p->pPars->fOneHotness != 0) {
    p->pSat = s;
    iVar5 = Abc_NtkAddOneHotness(p);
    if (iVar5 == 0) {
      return (sat_solver *)0x0;
    }
    p->pSat = (sat_solver *)0x0;
  }
  pCVar3 = p->pCnf;
  if (0 < pCVar3->nLiterals) {
    piVar4 = *pCVar3->pClauses;
    lVar8 = 0;
    do {
      piVar4[lVar8] = piVar4[lVar8] + pCVar3->nVars * -2;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pCVar3->nLiterals);
  }
  local_38 = CONCAT44(local_38._4_4_,((uint)local_38 ^ 1) + pCVar3->nVars * 2);
  iVar5 = sat_solver_addclause(s,(lit *)&local_38,(lit *)((long)&local_38 + 4));
  if (iVar5 != 0) {
    if (pCands == (int *)0x0) {
      p->vProjVarsSat->nSize = 0;
      pVVar7 = p->vProjVarsCnf;
      iVar5 = pVVar7->nSize;
      if (0 < iVar5) {
        lVar8 = 0;
        do {
          iVar5 = p->pCnf->nVars;
          iVar5 = Abc_MfsSatAddXor(s,pVVar7->pArray[lVar8],iVar5 + pVVar7->pArray[lVar8],
                                   (int)lVar8 + iVar5 * 2);
          if (iVar5 == 0) goto LAB_004c8324;
          Vec_IntPush(p->vProjVarsSat,(int)lVar8 + p->pCnf->nVars * 2);
          lVar8 = lVar8 + 1;
          pVVar7 = p->vProjVarsCnf;
          iVar5 = pVVar7->nSize;
        } while (lVar8 < iVar5);
      }
      if (iVar5 != p->vProjVarsSat->nSize) {
        __assert_fail("Vec_IntSize(p->vProjVarsCnf) == Vec_IntSize(p->vProjVarsSat)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsInter.c"
                      ,0xd3,"sat_solver *Abc_MfsCreateSolverResub(Mfs_Man_t *, int *, int, int)");
      }
      iVar5 = sat_solver_simplify(s);
      if (iVar5 != 0) {
        return s;
      }
    }
    else {
      if (nCands < 1) {
LAB_004c8298:
        sat_solver_store_mark_roots(s);
        return s;
      }
      uVar10 = (ulong)(uint)nCands;
      while( true ) {
        iVar5 = p->pCnf->nVars;
        uVar11 = (*pCands >> 1) + iVar5 * -2;
        if (((int)uVar11 < 0) || (p->vProjVarsCnf->nSize <= (int)uVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVarA = p->vProjVarsCnf->pArray[uVar11];
        iVar5 = Abc_MfsSatAddXor(s,iVarA,iVar5 + iVarA,*pCands >> 1);
        if (iVar5 == 0) break;
        iVar5 = sat_solver_addclause(s,pCands,pCands + 1);
        if (iVar5 == 0) break;
        uVar10 = uVar10 - 1;
        pCands = pCands + 1;
        if (uVar10 == 0) goto LAB_004c8298;
      }
    }
  }
LAB_004c8324:
  sat_solver_delete(s);
  return (sat_solver *)0x0;
}

Assistant:

sat_solver * Abc_MfsCreateSolverResub( Mfs_Man_t * p, int * pCands, int nCands, int fInvert )
{
    sat_solver * pSat;
    Aig_Obj_t * pObjPo;
    int Lits[2], status, iVar, i, c;

    // get the literal for the output of F
    pObjPo = Aig_ManCo( p->pAigWin, Aig_ManCoNum(p->pAigWin) - Vec_PtrSize(p->vDivs) - 1 );
    Lits[0] = toLitCond( p->pCnf->pVarNums[pObjPo->Id], fInvert );

    // collect the outputs of the divisors
    Vec_IntClear( p->vProjVarsCnf );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, p->pAigWin->vCos, pObjPo, i, Aig_ManCoNum(p->pAigWin) - Vec_PtrSize(p->vDivs) )
    {
        assert( p->pCnf->pVarNums[pObjPo->Id] >= 0 );
        Vec_IntPush( p->vProjVarsCnf, p->pCnf->pVarNums[pObjPo->Id] );
    }
    assert( Vec_IntSize(p->vProjVarsCnf) == Vec_PtrSize(p->vDivs) );

    // start the solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 2 * p->pCnf->nVars + Vec_PtrSize(p->vDivs) );
    if ( pCands )
        sat_solver_store_alloc( pSat );

    // load the first copy of the clauses
    for ( i = 0; i < p->pCnf->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, p->pCnf->pClauses[i], p->pCnf->pClauses[i+1] ) )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    // add the clause for the first output of F
    if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
    {
        sat_solver_delete( pSat );
        return NULL;
    }

    // add one-hotness constraints
    if ( p->pPars->fOneHotness )
    {
        p->pSat = pSat;
        if ( !Abc_NtkAddOneHotness( p ) )
            return NULL;
        p->pSat = NULL;
    }

    // bookmark the clauses of A
    if ( pCands )
        sat_solver_store_mark_clauses_a( pSat );

    // transform the literals
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
        p->pCnf->pClauses[0][i] += 2 * p->pCnf->nVars;
    // load the second copy of the clauses
    for ( i = 0; i < p->pCnf->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, p->pCnf->pClauses[i], p->pCnf->pClauses[i+1] ) )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    // add one-hotness constraints
    if ( p->pPars->fOneHotness )
    {
        p->pSat = pSat;
        if ( !Abc_NtkAddOneHotness( p ) )
            return NULL;
        p->pSat = NULL;
    }
    // transform the literals
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
        p->pCnf->pClauses[0][i] -= 2 * p->pCnf->nVars;
    // add the clause for the second output of F
    Lits[0] = 2 * p->pCnf->nVars + lit_neg( Lits[0] );
    if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
    {
        sat_solver_delete( pSat );
        return NULL;
    }

    if ( pCands )
    {
        // add relevant clauses for EXOR gates
        for ( c = 0; c < nCands; c++ )
        {
            // get the variable number of this divisor
            i = lit_var( pCands[c] ) - 2 * p->pCnf->nVars;
            // get the corresponding SAT variable
            iVar = Vec_IntEntry( p->vProjVarsCnf, i );
            // add the corresponding EXOR gate
            if ( !Abc_MfsSatAddXor( pSat, iVar, iVar + p->pCnf->nVars, 2 * p->pCnf->nVars + i ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
            // add the corresponding clause
            if ( !sat_solver_addclause( pSat, pCands + c, pCands + c + 1 ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
        }
        // bookmark the roots
        sat_solver_store_mark_roots( pSat );
    }
    else
    {
        // add the clauses for the EXOR gates - and remember their outputs
        Vec_IntClear( p->vProjVarsSat );
        Vec_IntForEachEntry( p->vProjVarsCnf, iVar, i )
        {
            if ( !Abc_MfsSatAddXor( pSat, iVar, iVar + p->pCnf->nVars, 2 * p->pCnf->nVars + i ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
            Vec_IntPush( p->vProjVarsSat, 2 * p->pCnf->nVars + i );
        }
        assert( Vec_IntSize(p->vProjVarsCnf) == Vec_IntSize(p->vProjVarsSat) );
        // simplify the solver
        status = sat_solver_simplify(pSat);
        if ( status == 0 )
        {
//            printf( "Abc_MfsCreateSolverResub(): SAT solver construction has failed. Skipping node.\n" );
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    return pSat;
}